

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O0

int der_cmp(void *a,void *b)

{
  undefined4 local_3c;
  int i;
  int cmplen;
  DER_ENC *d2;
  DER_ENC *d1;
  void *b_local;
  void *a_local;
  
  if (*(int *)((long)a + 8) < *(int *)((long)b + 8)) {
    local_3c = *(int *)((long)a + 8);
  }
  else {
    local_3c = *(int *)((long)b + 8);
  }
  a_local._4_4_ = OPENSSL_memcmp(*a,*b,(long)local_3c);
  if (a_local._4_4_ == 0) {
    a_local._4_4_ = *(int *)((long)a + 8) - *(int *)((long)b + 8);
  }
  return a_local._4_4_;
}

Assistant:

static int der_cmp(const void *a, const void *b) {
  const DER_ENC *d1 = reinterpret_cast<const DER_ENC *>(a),
                *d2 = reinterpret_cast<const DER_ENC *>(b);
  int cmplen, i;
  cmplen = (d1->length < d2->length) ? d1->length : d2->length;
  i = OPENSSL_memcmp(d1->data, d2->data, cmplen);
  if (i) {
    return i;
  }
  return d1->length - d2->length;
}